

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGeneratorExpressionNode.cxx
# Opt level: O2

void TargetFilesystemArtifactDependencyCMP0112::AddDependency
               (cmGeneratorTarget *target,cmGeneratorExpressionContext *context)

{
  cmLocalGenerator *this;
  cmMakefile *this_00;
  bool bVar1;
  PolicyStatus PVar2;
  string *args;
  cmake *this_01;
  PolicyID id;
  cmGeneratorTarget *target_local;
  cmAlphaNum local_c0;
  string err;
  string local_70;
  cmAlphaNum local_50;
  
  target_local = target;
  std::
  _Rb_tree<cmGeneratorTarget_const*,cmGeneratorTarget_const*,std::_Identity<cmGeneratorTarget_const*>,std::less<cmGeneratorTarget_const*>,std::allocator<cmGeneratorTarget_const*>>
  ::_M_insert_unique<cmGeneratorTarget_const*const&>
            ((_Rb_tree<cmGeneratorTarget_const*,cmGeneratorTarget_const*,std::_Identity<cmGeneratorTarget_const*>,std::less<cmGeneratorTarget_const*>,std::allocator<cmGeneratorTarget_const*>>
              *)&context->AllTargets,&target_local);
  this = context->LG;
  PVar2 = cmGeneratorTarget::GetPolicyStatusCMP0112(target_local);
  if (PVar2 != OLD) {
    if (PVar2 != WARN) {
      return;
    }
    this_00 = this->Makefile;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_c0,"CMAKE_POLICY_WARNING_CMP0112",(allocator<char> *)&local_50);
    bVar1 = cmMakefile::PolicyOptionalWarningEnabled(this_00,(string *)&local_c0);
    std::__cxx11::string::~string((string *)&local_c0);
    if (bVar1) {
      cmPolicies::GetPolicyWarning_abi_cxx11_(&local_70,(cmPolicies *)0x70,id);
      local_c0.View_._M_len = local_70._M_string_length;
      local_c0.View_._M_str = local_70._M_dataplus._M_p;
      local_50.View_._M_len = 0x26;
      local_50.View_._M_str = "\nDependency being added to target:\n  \"";
      args = cmGeneratorTarget::GetName_abi_cxx11_(target_local);
      cmStrCat<std::__cxx11::string,char[3]>(&err,&local_c0,&local_50,args,(char (*) [3])0x64ab03);
      std::__cxx11::string::~string((string *)&local_70);
      this_01 = cmLocalGenerator::GetCMakeInstance(this);
      cmake::IssueMessage(this_01,AUTHOR_WARNING,&err,&context->Backtrace);
      std::__cxx11::string::~string((string *)&err);
    }
  }
  std::
  _Rb_tree<cmGeneratorTarget*,cmGeneratorTarget*,std::_Identity<cmGeneratorTarget*>,std::less<cmGeneratorTarget*>,std::allocator<cmGeneratorTarget*>>
  ::_M_insert_unique<cmGeneratorTarget*const&>
            ((_Rb_tree<cmGeneratorTarget*,cmGeneratorTarget*,std::_Identity<cmGeneratorTarget*>,std::less<cmGeneratorTarget*>,std::allocator<cmGeneratorTarget*>>
              *)&context->DependTargets,&target_local);
  return;
}

Assistant:

static void AddDependency(cmGeneratorTarget* target,
                            cmGeneratorExpressionContext* context)
  {
    context->AllTargets.insert(target);
    cmLocalGenerator* lg = context->LG;
    switch (target->GetPolicyStatusCMP0112()) {
      case cmPolicies::WARN:
        if (lg->GetMakefile()->PolicyOptionalWarningEnabled(
              "CMAKE_POLICY_WARNING_CMP0112")) {
          std::string err =
            cmStrCat(cmPolicies::GetPolicyWarning(cmPolicies::CMP0112),
                     "\nDependency being added to target:\n  \"",
                     target->GetName(), "\"\n");
          lg->GetCMakeInstance()->IssueMessage(MessageType ::AUTHOR_WARNING,
                                               err, context->Backtrace);
        }
        CM_FALLTHROUGH;
      case cmPolicies::OLD:
        context->DependTargets.insert(target);
        break;
      case cmPolicies::REQUIRED_IF_USED:
      case cmPolicies::REQUIRED_ALWAYS:
      case cmPolicies::NEW:
        break;
    }
  }